

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint32 ma_dr_wav_get_bytes_per_pcm_frame(ma_dr_wav *pWav)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  
  if ((pWav->bitsPerSample & 7) == 0) {
    mVar2 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
  }
  else {
    mVar2 = (ma_uint32)(pWav->fmt).blockAlign;
  }
  if (((pWav->translatedFormatTag & 0xfffe) != 6) || (mVar1 = 0, mVar2 == (pWav->fmt).channels)) {
    mVar1 = mVar2;
  }
  return mVar1;
}

Assistant:

MA_PRIVATE ma_uint32 ma_dr_wav_get_bytes_per_pcm_frame(ma_dr_wav* pWav)
{
    ma_uint32 bytesPerFrame;
    if ((pWav->bitsPerSample & 0x7) == 0) {
        bytesPerFrame = (pWav->bitsPerSample * pWav->fmt.channels) >> 3;
    } else {
        bytesPerFrame = pWav->fmt.blockAlign;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW || pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        if (bytesPerFrame != pWav->fmt.channels) {
            return 0;
        }
    }
    return bytesPerFrame;
}